

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O0

SmallVector<wasm::Literal,_1UL> * __thiscall
wasm::SmallVector<wasm::Literal,_1UL>::operator=
          (SmallVector<wasm::Literal,_1UL> *this,SmallVector<wasm::Literal,_1UL> *other)

{
  SmallVector<wasm::Literal,_1UL> *other_local;
  SmallVector<wasm::Literal,_1UL> *this_local;
  
  this->usedFixed = other->usedFixed;
  std::array<wasm::Literal,_1UL>::operator=(&this->fixed,&other->fixed);
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::operator=
            (&this->flexible,&other->flexible);
  return this;
}

Assistant:

SmallVector<T, N>& operator=(SmallVector<T, N>&& other) {
    usedFixed = other.usedFixed;
    fixed = std::move(other.fixed);
    flexible = std::move(other.flexible);
    return *this;
  }